

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

int det_3d_filter(double *p0,double *p1,double *p2)

{
  double dVar1;
  double dVar2;
  double local_68;
  double upper_bound_1;
  double lower_bound_1;
  double max3;
  double max2;
  double max1;
  double eps;
  int int_tmp_result;
  double Delta;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  dVar1 = *p2 * (p0[1] * p1[2] + -(p0[2] * p1[1])) +
          *p0 * (p1[1] * p2[2] + -(p1[2] * p2[1])) + -(*p1 * (p0[1] * p2[2] + -(p0[2] * p2[1])));
  max2 = ABS(*p0);
  if (max2 < ABS(*p1)) {
    max2 = ABS(*p1);
  }
  if (max2 < ABS(*p2)) {
    max2 = ABS(*p2);
  }
  max3 = ABS(p0[1]);
  if (max3 < ABS(p0[2])) {
    max3 = ABS(p0[2]);
  }
  if (max3 < ABS(p1[1])) {
    max3 = ABS(p1[1]);
  }
  if (max3 < ABS(p1[2])) {
    max3 = ABS(p1[2]);
  }
  lower_bound_1 = ABS(p1[1]);
  if (lower_bound_1 < ABS(p1[2])) {
    lower_bound_1 = ABS(p1[2]);
  }
  if (lower_bound_1 < ABS(p2[1])) {
    lower_bound_1 = ABS(p2[1]);
  }
  if (lower_bound_1 < ABS(p2[2])) {
    lower_bound_1 = ABS(p2[2]);
  }
  upper_bound_1 = max2;
  local_68 = max2;
  if (max2 <= max3) {
    if (max2 < max3) {
      local_68 = max3;
    }
  }
  else {
    upper_bound_1 = max3;
  }
  if (upper_bound_1 <= lower_bound_1) {
    if (local_68 < lower_bound_1) {
      local_68 = lower_bound_1;
    }
  }
  else {
    upper_bound_1 = lower_bound_1;
  }
  if (1.9266338798187158e-98 <= upper_bound_1) {
    if (local_68 <= 1.1198723710889019e+102) {
      dVar2 = max3 * lower_bound_1 * max2 * 3.1113355567168077e-15;
      if (dVar1 <= dVar2) {
        if (-dVar2 <= dVar1) {
          return 0;
        }
        eps._4_4_ = -1;
      }
      else {
        eps._4_4_ = 1;
      }
      p0_local._4_4_ = eps._4_4_;
    }
    else {
      p0_local._4_4_ = 0;
    }
  }
  else {
    p0_local._4_4_ = 0;
  }
  return p0_local._4_4_;
}

Assistant:

inline int det_3d_filter( const double* p0, const double* p1, const double* p2) {
    double Delta;
    Delta = (((p0[0] * ((p1[1] * p2[2]) - (p1[2] * p2[1]))) - (p1[0] * ((p0[1] * p2[2]) - (p0[2] * p2[1])))) + (p2[0] * ((p0[1] * p1[2]) - (p0[2] * p1[1]))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p0[0]);
    if( (max1 < fabs(p1[0])) )
    {
        max1 = fabs(p1[0]);
    } 
    if( (max1 < fabs(p2[0])) )
    {
        max1 = fabs(p2[0]);
    } 
    double max2 = fabs(p0[1]);
    if( (max2 < fabs(p0[2])) )
    {
        max2 = fabs(p0[2]);
    } 
    if( (max2 < fabs(p1[1])) )
    {
        max2 = fabs(p1[1]);
    } 
    if( (max2 < fabs(p1[2])) )
    {
        max2 = fabs(p1[2]);
    } 
    double max3 = fabs(p1[1]);
    if( (max3 < fabs(p1[2])) )
    {
        max3 = fabs(p1[2]);
    } 
    if( (max3 < fabs(p2[1])) )
    {
        max3 = fabs(p2[1]);
    } 
    if( (max3 < fabs(p2[2])) )
    {
        max3 = fabs(p2[2]);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.92663387981871579179e-98) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.11987237108890185662e+102) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (3.11133555671680765034e-15 * ((max2 * max3) * max1));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}